

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int __thiscall
CVmObjBigNum::getp_is_neg(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  byte bVar1;
  int iVar2;
  vm_datatype_t vVar3;
  
  if (getp_is_neg(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_is_neg();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_is_neg::desc);
  if (iVar2 == 0) {
    bVar1 = (this->super_CVmObject).ext_[4];
    if ((bVar1 & 2) == 0) {
      vVar3 = (bVar1 & 1) + VM_NIL;
    }
    else {
      vVar3 = VM_NIL;
    }
    retval->typ = vVar3;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_is_neg(VMG_ vm_obj_id_t self,
                              vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* if I'm not an ordinary number or an infinity, I'm not negative */
    if (get_type(ext_) != VMBN_T_NUM && get_type(ext_) != VMBN_T_INF)
    {
        /* I'm not negative, so return nil */
        retval->set_nil();
    }
    else
    {
        /* set the return value to true if I'm negative, nil if not */
        retval->set_logical(get_neg(ext_));
    }

    /* handled */
    return TRUE;
}